

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void Omega_h::fill<double>(Write<double> *a,double val)

{
  undefined1 local_48 [8];
  type_conflict2 f;
  double val_local;
  Write<double> *a_local;
  ulong local_10;
  
  f.val = val;
  Write<double>::Write((Write<double> *)local_48,a);
  f.a.shared_alloc_.direct_ptr = (void *)f.val;
  if (((ulong)(a->shared_alloc_).alloc & 1) == 0) {
    local_10 = ((a->shared_alloc_).alloc)->size;
  }
  else {
    local_10 = (ulong)(a->shared_alloc_).alloc >> 3;
  }
  parallel_for<Omega_h::fill<double>(Omega_h::Write<double>,double)::_lambda(int)_1_>
            ((LO)(local_10 >> 3),(type_conflict2 *)local_48,"Write(size,value)");
  fill<double>(Omega_h::Write<double>,double)::{lambda(int)#1}::~Write((_lambda_int__1_ *)local_48);
  return;
}

Assistant:

void fill(Write<T> a, T val) {
  auto f = OMEGA_H_LAMBDA(LO i) { a[i] = val; };
  parallel_for(a.size(), f, "Write(size,value)");
}